

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NativeCodeGenerator.cpp
# Opt level: O0

JavascriptMethod NativeCodeGenerator::CheckAsmJsCodeGen(ScriptFunction *function)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  undefined4 *puVar5;
  FunctionBody *this;
  ScriptContext *this_00;
  NativeCodeGenerator *manager;
  ThreadContext *pTVar6;
  FunctionEntryPointInfo *holder;
  JobProcessor *pJVar7;
  undefined4 extraout_var;
  FunctionBody *pFVar8;
  undefined4 extraout_var_00;
  ScriptFunction *pSVar9;
  FunctionEntryPointInfo *entryPoint;
  NativeCodeGenerator *nativeCodeGen;
  ScriptContext *scriptContext;
  FunctionBody *functionBody;
  ScriptFunction *function_local;
  
  if (function == (ScriptFunction *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/NativeCodeGenerator.cpp"
                       ,0x628,"(function)","function");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  this = Js::JavascriptFunction::GetFunctionBody((JavascriptFunction *)function);
  this_00 = Js::FunctionProxy::GetScriptContext((FunctionProxy *)this);
  manager = Js::ScriptContext::GetNativeCodeGenerator(this_00);
  pTVar6 = Js::ScriptContext::GetThreadContext(this_00);
  bVar2 = ThreadContext::IsScriptActive(pTVar6);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/NativeCodeGenerator.cpp"
                       ,0x62d,"(scriptContext->GetThreadContext()->IsScriptActive())",
                       "scriptContext->GetThreadContext()->IsScriptActive()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  pTVar6 = Js::ScriptContext::GetThreadContext(this_00);
  bVar2 = ThreadContext::IsInScript(pTVar6);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/NativeCodeGenerator.cpp"
                       ,0x62e,"(scriptContext->GetThreadContext()->IsInScript())",
                       "scriptContext->GetThreadContext()->IsInScript()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  bVar2 = Js::ParseableFunctionInfo::IsWasmFunction(&this->super_ParseableFunctionInfo);
  if ((bVar2) && (uVar3 = Js::FunctionBody::GetByteCodeCount(this), uVar3 == 0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/NativeCodeGenerator.cpp"
                       ,0x630,
                       "(!functionBody->IsWasmFunction() || functionBody->GetByteCodeCount() > 0)",
                       "Wasm function should be parsed by now");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  holder = Js::ScriptFunction::GetFunctionEntryPointInfo(function);
  bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01eb5b30,AsmJsJITTemplatePhase);
  if (((bVar2) && (-1 < DAT_01eafd60)) ||
     ((bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01eb5b30,AsmJsJITTemplatePhase), !bVar2 &&
      (-1 < DAT_01eafd68)))) {
    pJVar7 = JsUtil::JobManager::Processor((JobManager *)manager);
    JsUtil::JobProcessor::PrioritizeJobAndWait<NativeCodeGenerator,Js::FunctionEntryPointInfo*>
              (pJVar7,manager,holder,function);
  }
  else {
    pJVar7 = JsUtil::JobManager::Processor((JobManager *)manager);
    bVar2 = JsUtil::JobProcessor::PrioritizeJob<NativeCodeGenerator,Js::FunctionEntryPointInfo*>
                      (pJVar7,manager,holder,function);
    if (!bVar2) {
      bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,AsmjsEntryPointInfoPhase);
      if (bVar2) {
        pFVar8 = Js::JavascriptFunction::GetFunctionBody((JavascriptFunction *)function);
        iVar4 = (*(pFVar8->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject.
                  super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])();
        Output::Print(L"Codegen not done yet for function: %s, Entrypoint is CheckAsmJsCodeGenThunk\n"
                      ,CONCAT44(extraout_var,iVar4));
      }
      pSVar9 = (ScriptFunction *)Js::FunctionProxy::GetOriginalEntryPoint((FunctionProxy *)this);
      return (JavascriptMethod)pSVar9;
    }
  }
  bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,AsmjsEntryPointInfoPhase);
  if (bVar2) {
    pFVar8 = Js::JavascriptFunction::GetFunctionBody((JavascriptFunction *)function);
    iVar4 = (*(pFVar8->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject.
              super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])();
    Output::Print(L"CodeGen Done for function: %s, Changing Entrypoint to Full JIT\n",
                  CONCAT44(extraout_var_00,iVar4));
  }
  pSVar9 = (ScriptFunction *)CheckCodeGenDone(this,holder,function);
  return (JavascriptMethod)pSVar9;
}

Assistant:

Js::JavascriptMethod
NativeCodeGenerator::CheckAsmJsCodeGen(Js::ScriptFunction * function)
{
    Assert(function);
    Js::FunctionBody *functionBody = function->GetFunctionBody();
    Js::ScriptContext *scriptContext = functionBody->GetScriptContext();

    NativeCodeGenerator *nativeCodeGen = scriptContext->GetNativeCodeGenerator();
    Assert(scriptContext->GetThreadContext()->IsScriptActive());
    Assert(scriptContext->GetThreadContext()->IsInScript());

    AssertOrFailFastMsg(!functionBody->IsWasmFunction() || functionBody->GetByteCodeCount() > 0, "Wasm function should be parsed by now");
    // Load the entry point here to validate it got changed afterwards

    Js::FunctionEntryPointInfo* entryPoint = function->GetFunctionEntryPointInfo();

#if ENABLE_DEBUG_CONFIG_OPTIONS
    if ((PHASE_ON1(Js::AsmJsJITTemplatePhase) && CONFIG_FLAG(MaxTemplatizedJitRunCount) >= 0) || (!PHASE_ON1(Js::AsmJsJITTemplatePhase) && CONFIG_FLAG(MaxAsmJsInterpreterRunCount) >= 0))
    {
        nativeCodeGen->Processor()->PrioritizeJobAndWait(nativeCodeGen, entryPoint, function);
    } else
#endif
    if (!nativeCodeGen->Processor()->PrioritizeJob(nativeCodeGen, entryPoint, function))
    {
        if (PHASE_TRACE1(Js::AsmjsEntryPointInfoPhase))
        {
            Output::Print(_u("Codegen not done yet for function: %s, Entrypoint is CheckAsmJsCodeGenThunk\n"), function->GetFunctionBody()->GetDisplayName());
        }
        return functionBody->GetOriginalEntryPoint();
    }
    if (PHASE_TRACE1(Js::AsmjsEntryPointInfoPhase))
    {
        Output::Print(_u("CodeGen Done for function: %s, Changing Entrypoint to Full JIT\n"), function->GetFunctionBody()->GetDisplayName());
    }
    // we will need to set the functionbody external and asmjs entrypoint to the fulljit entrypoint
    return CheckCodeGenDone(functionBody, entryPoint, function);
}